

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::Copy
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  undefined4 in_register_0000008c;
  uint uVar8;
  uchar *__src;
  uint local_68;
  uint local_64;
  undefined8 local_60;
  ImageTemplate<unsigned_char> local_58;
  
  local_60 = CONCAT44(in_register_0000008c,startYOut);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  bVar4 = CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>(in,out);
  local_64 = (uint)bVar4;
  local_68 = width * local_64;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,out);
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&local_68,&height,in,&local_58);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
  uVar1 = in->_rowSize;
  uVar2 = out->_rowSize;
  iVar5 = (int)local_60;
  puVar3 = out->_data;
  uVar6 = startXOut * local_64;
  __src = in->_data + (ulong)(startXIn * local_64) + (ulong)(startYIn * uVar1);
  uVar8 = height * uVar2;
  for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + uVar2) {
    memcpy(puVar3 + uVar7 + (ulong)uVar6 + (ulong)(iVar5 * uVar2),__src,(ulong)local_68);
    __src = __src + uVar1;
  }
  return;
}

Assistant:

void Copy( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
               uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );

        const uint8_t colorCount  = CommonColorCount( in, out );
        width = width * colorCount;

        OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn  * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn )
            memcpy( outY, inY, sizeof( uint8_t ) * width );
    }